

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

void __thiscall
pbrt::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,CameraBaseParameters *baseParameters,Float fov,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  undefined1 auVar1 [60];
  long in_RDI;
  Tuple3<pbrt::Point3,float> *this_00;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [56];
  Point3<float> PVar18;
  Vector3<float> VVar19;
  Point3f pMax;
  Point3f pMin;
  Point2i res;
  Vector3f wCornerCamera;
  Point3f pCorner;
  Bounds2f *in_stack_00000138;
  Transform *in_stack_00000140;
  Point2f radius;
  ProjectiveCamera *in_stack_00000150;
  PerspectiveCamera *p;
  CameraBaseParameters *in_stack_fffffffffffff9c0;
  Point3<float> *this_01;
  Point3<float> *p_00;
  Point3<float> *this_02;
  Vector3<float> *v;
  undefined8 local_5a4;
  float local_59c;
  undefined8 local_598;
  float local_590;
  undefined8 local_578;
  float local_570;
  Tuple2<pbrt::Point2,_int> local_568;
  undefined8 local_560;
  float local_558;
  undefined8 local_550;
  float local_548;
  undefined8 local_540;
  float local_538;
  undefined8 local_528;
  float local_520;
  undefined8 local_508;
  undefined8 local_4f8;
  float local_4f0;
  undefined8 local_4e8;
  float local_4e0;
  undefined8 local_4c8;
  float local_4c0;
  undefined8 in_stack_fffffffffffffb48;
  Float f;
  Float in_stack_fffffffffffffb50;
  Float in_stack_fffffffffffffb54;
  Vector3<float> local_4a4;
  Point3<float> *in_stack_fffffffffffffb68;
  Point3<float> *p_01;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  Point3<float> local_454;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  Point3<float> local_424;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  Point3<float> local_3f8 [10];
  CameraHandle *in_stack_ffffffffffffff08;
  CameraBase *in_stack_ffffffffffffff10;
  undefined1 auVar13 [56];
  undefined1 extraout_var [56];
  
  f = (Float)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  p = (PerspectiveCamera *)&stack0xfffffffffffffc88;
  CameraBaseParameters::CameraBaseParameters(in_stack_fffffffffffff9c0,(CameraBaseParameters *)p);
  this_01 = local_3f8;
  Perspective(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,f);
  ProjectiveCamera::ProjectiveCamera
            (in_stack_00000150,(CameraBaseParameters *)radius.super_Tuple2<pbrt::Point2,_float>,
             in_stack_00000140,in_stack_00000138,pCorner.super_Tuple3<pbrt::Point3,_float>.z,
             pCorner.super_Tuple3<pbrt::Point3,_float>.y);
  Vector3<float>::Vector3((Vector3<float> *)0x753041);
  Vector3<float>::Vector3((Vector3<float> *)0x753052);
  p_00 = &local_424;
  auVar13 = (undefined1  [56])0x0;
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                      in_stack_fffffffffffffb68);
  local_430 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar13;
  local_438 = vmovlpd_avx(auVar2._0_16_);
  this_02 = &local_454;
  auVar13 = ZEXT856(0);
  uVar15 = 0;
  local_418 = local_438;
  local_410 = local_430;
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                      in_stack_fffffffffffffb68);
  local_440 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar13;
  local_448 = vmovlpd_avx(auVar3._0_16_);
  VVar19 = Point3<float>::operator-(this_02,p_00);
  local_400 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar13;
  auVar17 = ZEXT856(uVar15);
  local_408 = vmovlpd_avx(auVar4._0_16_);
  *(float *)(in_RDI + 0x590) = local_400;
  *(undefined8 *)(in_RDI + 0x588) = local_408;
  v = &local_4a4;
  auVar13 = ZEXT856(0);
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                      in_stack_fffffffffffffb68);
  fVar14 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar13;
  p_01 = (Point3<float> *)vmovlpd_avx(auVar5._0_16_);
  auVar13 = ZEXT856(0);
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()((Transform *)CONCAT44(in_stack_fffffffffffffb74,fVar14),p_01);
  local_4e0 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar13;
  local_4e8 = vmovlpd_avx(auVar6._0_16_);
  local_4c8 = local_4e8;
  local_4c0 = local_4e0;
  VVar19 = Point3<float>::operator-(this_02,p_00);
  local_4f0 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  local_4f8 = vmovlpd_avx(auVar7._0_16_);
  *(float *)(in_RDI + 0x59c) = local_4f0;
  *(undefined8 *)(in_RDI + 0x594) = local_4f8;
  FilmHandle::GetFilter((FilmHandle *)p_00);
  auVar8._0_8_ = FilterHandle::Radius((FilterHandle *)p);
  auVar8._8_56_ = extraout_var;
  local_508 = vmovlpd_avx(auVar8._0_16_);
  Point2<float>::Point2<float>((Point2<float> *)this_01,(Vector2<float> *)p);
  auVar1._4_56_ = auVar17;
  auVar1._0_4_ = 0x80000000;
  auVar16._0_8_ = auVar1._0_8_ << 0x20;
  auVar16._8_4_ = 0x80000000;
  auVar16._12_4_ = 0x80000000;
  auVar13 = ZEXT856(auVar16._8_8_);
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()((Transform *)CONCAT44(in_stack_fffffffffffffb74,fVar14),p_01);
  local_548 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  local_550 = vmovlpd_avx(auVar9._0_16_);
  local_540 = local_550;
  local_538 = local_548;
  Vector3<float>::Vector3<float>((Vector3<float> *)this_01,(Point3<float> *)p);
  VVar19 = Normalize<float>(v);
  local_558 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar13;
  local_560 = vmovlpd_avx(auVar10._0_16_);
  *(float *)(in_RDI + 0x5a0) = local_558;
  local_528 = local_560;
  local_520 = local_558;
  local_568 = (Tuple2<pbrt::Point2,_int>)FilmHandle::FullResolution((FilmHandle *)p);
  auVar13 = ZEXT856(0);
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()((Transform *)CONCAT44(in_stack_fffffffffffffb74,fVar14),p_01);
  local_590 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar13;
  local_598 = vmovlpd_avx(auVar11._0_16_);
  auVar13 = ZEXT856(auVar13._0_8_);
  local_578 = local_598;
  local_570 = local_590;
  Point3<float>::Point3(this_01,(float)((ulong)p >> 0x20),SUB84(p,0),0.0);
  PVar18 = Transform::operator()((Transform *)CONCAT44(in_stack_fffffffffffffb74,fVar14),p_01);
  local_59c = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar12._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar13;
  local_5a4 = vmovlpd_avx(auVar12._0_16_);
  Tuple3<pbrt::Point3,float>::operator/=((Tuple3<pbrt::Point3,float> *)&local_578,local_570);
  this_00 = (Tuple3<pbrt::Point3,float> *)&local_5a4;
  Tuple3<pbrt::Point3,float>::operator/=(this_00,local_59c);
  fVar14 = ((float)local_5a4 - (float)local_578) * (local_5a4._4_4_ - local_578._4_4_);
  std::abs((int)this_00);
  *(float *)(in_RDI + 0x5a4) = fVar14;
  CameraHandle::TaggedPointer<pbrt::PerspectiveCamera>((CameraHandle *)this_01,p);
  CameraBase::FindMinimumDifferentials(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  return;
}

Assistant:

PerspectiveCamera(CameraBaseParameters baseParameters, Float fov,
                      const Bounds2f &screenWindow, Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Perspective(fov, 1e-2f, 1000.f), screenWindow,
                           lensRadius, focalDistance) {
        // Compute differential changes in origin for perspective camera rays
        dxCamera =
            cameraFromRaster(Point3f(1, 0, 0)) - cameraFromRaster(Point3f(0, 0, 0));
        dyCamera =
            cameraFromRaster(Point3f(0, 1, 0)) - cameraFromRaster(Point3f(0, 0, 0));

        // Compute _cosTotalWidth_ for perspective camera
        Point2f radius = Point2f(film.GetFilter().Radius());
        Point3f pCorner(-radius.x, -radius.y, 0.f);
        Vector3f wCornerCamera = Normalize(Vector3f(cameraFromRaster(pCorner)));
        cosTotalWidth = wCornerCamera.z;
        DCHECK_LT(.9999 * cosTotalWidth, std::cos(Radians(fov / 2)));

        // Compute image plane bounds at $z=1$ for _PerspectiveCamera_
        Point2i res = film.FullResolution();
        Point3f pMin = cameraFromRaster(Point3f(0, 0, 0));
        Point3f pMax = cameraFromRaster(Point3f(res.x, res.y, 0));
        pMin /= pMin.z;
        pMax /= pMax.z;
        A = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));

        // Compute minimum differentials for _PerspectiveCamera_
        FindMinimumDifferentials(this);
    }